

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_common.c
# Opt level: O0

MPP_RET jpegd_setup_output_fmt(JpegdHalCtx *ctx,JpegdSyntax *s,RK_S32 output)

{
  uint local_40;
  MppFrameFormat fmt;
  MPP_RET ret;
  MppFrame frm;
  PPInfo *pp_info;
  uint local_20;
  RK_U32 stride;
  RK_U32 pp_in_fmt;
  RK_S32 output_local;
  JpegdSyntax *s_local;
  JpegdHalCtx *ctx_local;
  
  stride = output;
  _pp_in_fmt = s;
  s_local = (JpegdSyntax *)ctx;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","enter\n","jpegd_setup_output_fmt");
  }
  local_20 = 0;
  pp_info._4_4_ = 0;
  frm = s_local->quant_matrixes[1] + 0x1a;
  _fmt = (MppFrame)0x0;
  if (((*(int *)(s_local->quant_matrixes[1] + 0x18) == 0) ||
      (*(int *)(s_local->quant_matrixes[1] + 10) == 0)) ||
     (*(MppFrameFormat *)(s_local->quant_matrixes[1] + 8) == _pp_in_fmt->output_fmt)) {
    *(MppFrameFormat *)(s_local->quant_matrixes[1] + 8) = _pp_in_fmt->output_fmt;
    *(undefined1 *)frm = 0;
  }
  else {
    switch(_pp_in_fmt->output_fmt) {
    case MPP_FMT_YUV420SP:
      local_20 = 1;
      break;
    default:
      if ((jpegd_debug & 0x80) != 0) {
        _mpp_log_l(4,"HAL_JPEGD_COMMON","other output format %d\n",(char *)0x0,
                   (ulong)_pp_in_fmt->output_fmt);
      }
      break;
    case MPP_FMT_YUV422SP:
      local_20 = 4;
      break;
    case MPP_FMT_YUV400:
      local_20 = 3;
      break;
    case MPP_FMT_YUV440SP:
      local_20 = 6;
      break;
    case MPP_FMT_YUV411SP:
      local_20 = 8;
      break;
    case MPP_FMT_YUV444SP:
      local_20 = 7;
    }
    *(undefined1 *)frm = 1;
    *(char *)((long)frm + 1) = (char)local_20;
    local_40 = *(uint *)(s_local->quant_matrixes[1] + 8);
    if ((local_40 & 0x1000000) == 0x1000000) {
      local_40 = local_40 & 0xfffff;
    }
    if (local_40 - 0x10000 < 6) {
      *(undefined1 *)((long)frm + 2) = 0;
      pp_info._4_4_ = _pp_in_fmt->hor_stride << 1;
    }
    else if (local_40 - 0x1000a < 4) {
      *(undefined1 *)((long)frm + 2) = 1;
      pp_info._4_4_ = _pp_in_fmt->hor_stride << 2;
    }
    else {
      *(undefined1 *)((long)frm + 2) = 5;
    }
    if ((jpegd_debug & 0x80) != 0) {
      _mpp_log_l(4,"HAL_JPEGD_COMMON","Post Process! pp_in_fmt:%d, pp_out_fmt:%d",(char *)0x0,
                 (ulong)local_20,(ulong)*(byte *)((long)frm + 2));
    }
  }
  mpp_buf_slot_get_prop(*(MppBufSlots *)(s_local->quant_matrixes[0] + 4),stride,SLOT_FRAME_PTR,&fmt)
  ;
  mpp_frame_set_fmt(_fmt,*(MppFrameFormat *)(s_local->quant_matrixes[1] + 8));
  mpp_frame_set_hor_stride_pixel(_fmt,_pp_in_fmt->hor_stride);
  if (pp_info._4_4_ != 0) {
    mpp_frame_set_hor_stride(_fmt,pp_info._4_4_);
  }
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_COMMON","exit\n","jpegd_setup_output_fmt");
  }
  return MPP_OK;
}

Assistant:

MPP_RET jpegd_setup_output_fmt(JpegdHalCtx *ctx, JpegdSyntax *s, RK_S32 output)
{
    jpegd_dbg_func("enter\n");
    RK_U32 pp_in_fmt = 0;
    RK_U32 stride = 0;
    PPInfo *pp_info = &ctx->pp_info;
    MppFrame frm = NULL;
    MPP_RET ret = MPP_OK;

    if (ctx->have_pp && ctx->set_output_fmt_flag &&
        ctx->output_fmt != s->output_fmt) {
        MppFrameFormat fmt = MPP_FMT_BUTT;

        /* Using pp to convert all format to yuv420sp */
        switch (s->output_fmt) {
        case MPP_FMT_YUV400:
            pp_in_fmt = PP_IN_FORMAT_YUV400;
            break;
        case MPP_FMT_YUV420SP:
            pp_in_fmt = PP_IN_FORMAT_YUV420SEMI;
            break;
        case MPP_FMT_YUV422SP:
            pp_in_fmt = PP_IN_FORMAT_YUV422SEMI;
            break;
        case MPP_FMT_YUV440SP:
            pp_in_fmt = PP_IN_FORMAT_YUV440SEMI;
            break;
        case MPP_FMT_YUV411SP:
            pp_in_fmt = PP_IN_FORMAT_YUV411_SEMI;
            break;
        case MPP_FMT_YUV444SP:
            pp_in_fmt = PP_IN_FORMAT_YUV444_SEMI;
            break;
        default:
            jpegd_dbg_hal("other output format %d\n", s->output_fmt);
            break;
        }

        pp_info->pp_enable = 1;
        pp_info->pp_in_fmt = pp_in_fmt;

        fmt = ctx->output_fmt;

        if (MPP_FRAME_FMT_IS_LE(fmt)) {
            fmt &= MPP_FRAME_FMT_MASK;
        }

        switch (fmt) {
        case MPP_FMT_RGB565 :
        case MPP_FMT_BGR565 :
        case MPP_FMT_RGB555 :
        case MPP_FMT_BGR555 :
        case MPP_FMT_RGB444 :
        case MPP_FMT_BGR444 : {
            pp_info->pp_out_fmt = PP_OUT_FORMAT_RGB565;
            stride = s->hor_stride * 2;
        } break;
        case MPP_FMT_ARGB8888 :
        case MPP_FMT_ABGR8888 :
        case MPP_FMT_RGBA8888 :
        case MPP_FMT_BGRA8888 : {
            pp_info->pp_out_fmt = PP_OUT_FORMAT_ARGB;
            stride = s->hor_stride * 4;
        } break;
        default : {
            pp_info->pp_out_fmt = PP_OUT_FORMAT_YUV420INTERLAVE;
        } break;
        }

        jpegd_dbg_hal("Post Process! pp_in_fmt:%d, pp_out_fmt:%d",
                      pp_in_fmt, pp_info->pp_out_fmt);
    } else {
        /* keep original output format */
        ctx->output_fmt = s->output_fmt;
        pp_info->pp_enable = 0;
    }

    mpp_buf_slot_get_prop(ctx->frame_slots, output,
                          SLOT_FRAME_PTR, &frm);
    mpp_frame_set_fmt(frm, ctx->output_fmt);
    mpp_frame_set_hor_stride_pixel(frm, s->hor_stride);
    /* update RGBX format byte stride and pixel stride */
    if (stride)
        mpp_frame_set_hor_stride(frm, stride);

    jpegd_dbg_func("exit\n");
    return ret;
}